

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateDefaultBoxedObject_TTD(JavascriptLibrary *this,TypeId kind)

{
  Var number;
  TypeId kind_local;
  JavascriptLibrary *this_local;
  
  switch(kind) {
  case TypeIds_BooleanObject:
    this_local = (JavascriptLibrary *)CreateBooleanObject(this);
    break;
  case TypeIds_NumberObject:
    number = TaggedInt::ToVarUnchecked(0);
    this_local = (JavascriptLibrary *)CreateNumberObject(this,number);
    break;
  case TypeIds_StringObject:
    this_local = (JavascriptLibrary *)CreateStringObject(this,(JavascriptString *)0x0);
    break;
  default:
    TTDAbort_unrecoverable_error("Unsupported nullptr value boxed object.");
  case TypeIds_SymbolObject:
    this_local = (JavascriptLibrary *)CreateSymbolObject(this,(JavascriptSymbol *)0x0);
  }
  return (RecyclableObject *)this_local;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateDefaultBoxedObject_TTD(Js::TypeId kind)
    {
        switch(kind)
        {
        case Js::TypeIds_BooleanObject:
            return this->CreateBooleanObject();
        case Js::TypeIds_NumberObject:
            return this->CreateNumberObject(Js::TaggedInt::ToVarUnchecked(0));
        case Js::TypeIds_StringObject:
            return this->CreateStringObject(nullptr);
        case Js::TypeIds_SymbolObject:
            return this->CreateSymbolObject(nullptr);
        default:
            TTDAssert(false, "Unsupported nullptr value boxed object.");
            return nullptr;
        }
    }